

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O3

int IDAGetQuadDky(void *ida_mem,sunrealtype t,int k,N_Vector dkyQ)

{
  double dVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  char *msgfmt;
  int iVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  sunrealtype cjk [6];
  sunrealtype cjk_1 [6];
  double local_a0 [14];
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar4 = -0x14;
    ida_mem = (IDAMem)0x0;
    iVar5 = -0x14;
    iVar6 = 0xcb4;
  }
  else if (*(int *)((long)ida_mem + 0x60) == 1) {
    if (dkyQ == (N_Vector)0x0) {
      msgfmt = "dky = NULL illegal.";
      iVar4 = -0x1b;
      iVar5 = -0x1b;
      iVar6 = 0xcc6;
    }
    else {
      if ((-1 < k) && (k <= *(int *)((long)ida_mem + 0x4b8))) {
        dVar1 = *(double *)((long)ida_mem + 0x4f8);
        if ((t - ((dVar1 + *(double *)((long)ida_mem + 0x4e0)) *
                  *(double *)((long)ida_mem + 8) * -100.0 +
                 (dVar1 - *(double *)((long)ida_mem + 0x4e8)))) * *(double *)((long)ida_mem + 0x4e0)
            < 0.0) {
          IDAProcessError((IDAMem)ida_mem,-0x1a,0xcd9,"IDAGetQuadDky",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                          ,
                          "Illegal value for t.t = %.15g is not between tcur - hold = %.15g and tcur = %.15g"
                         );
          return -0x1a;
        }
        local_a0[5] = 0.0;
        local_a0[6] = 0.0;
        local_a0[3] = 0.0;
        local_a0[4] = 0.0;
        local_a0[1] = 0.0;
        local_a0[2] = 0.0;
        local_a0[7] = 0.0;
        local_a0[8] = 0.0;
        local_a0[9] = 0.0;
        local_a0[10] = 0.0;
        local_a0[0xb] = 0.0;
        local_a0[0xc] = 0.0;
        iVar6 = *(int *)((long)ida_mem + 0x4bc) - k;
        local_a0[0] = (double)(long)iVar6;
        iVar4 = 1;
        uVar7 = 0;
        do {
          uVar2 = (uint)uVar7;
          iVar5 = iVar6 + uVar2;
          if ((int)(iVar6 + uVar2) <= iVar4) {
            iVar5 = iVar4;
          }
          if (uVar7 == 0) {
            local_a0[1] = 1.0;
            dVar9 = 0.0;
          }
          else {
            dVar9 = *(double *)((long)ida_mem + uVar7 * 8 + 0x180);
            local_a0[uVar7 + 1] = ((double)(int)uVar2 * local_a0[uVar7]) / dVar9;
          }
          if (0 < iVar6) {
            lVar3 = (long)iVar4 + -1;
            dVar8 = local_a0[iVar4];
            do {
              dVar10 = dVar9 + (t - dVar1);
              dVar9 = *(double *)((long)ida_mem + lVar3 * 8 + 0x188);
              dVar8 = (local_a0[lVar3 + 7] * (double)(int)uVar2 + dVar10 * dVar8) / dVar9;
              local_a0[lVar3 + 2] = dVar8;
              lVar3 = lVar3 + 1;
            } while (lVar3 < (long)((long)local_a0[0] + uVar7));
            if (0 < iVar6) {
              memcpy(local_a0 + uVar7 + 8,local_a0 + uVar7 + 2,(ulong)(iVar5 + ~uVar2) * 8 + 8);
            }
          }
          uVar7 = uVar7 + 1;
          iVar4 = iVar4 + 1;
        } while (uVar7 != k + 1);
        iVar6 = N_VLinearCombination
                          (iVar6 + 1,local_a0 + (ulong)(uint)k + 1,
                           (long)ida_mem + (ulong)(uint)k * 8 + 0x300,dkyQ);
        if (iVar6 != 0) {
          return -0x1c;
        }
        return 0;
      }
      msgfmt = "Illegal value for k.";
      iVar4 = -0x19;
      iVar5 = -0x19;
      iVar6 = 0xcce;
    }
  }
  else {
    msgfmt = "Illegal attempt to call before calling IDAQuadInit.";
    iVar4 = -0x1e;
    iVar5 = -0x1e;
    iVar6 = 0xcbe;
  }
  IDAProcessError((IDAMem)ida_mem,iVar5,iVar6,"IDAGetQuadDky",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                  ,msgfmt);
  return iVar4;
}

Assistant:

int IDAGetQuadDky(void* ida_mem, sunrealtype t, int k, N_Vector dkyQ)
{
  IDAMem IDA_mem;
  sunrealtype tfuzz, tp, delt, psij_1;
  int i, j, retval;
  sunrealtype cjk[MXORDP1];
  sunrealtype cjk_1[MXORDP1];

  /* Check ida_mem */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  /* Check if quadrature was initialized */
  if (IDA_mem->ida_quadr != SUNTRUE)
  {
    IDAProcessError(IDA_mem, IDA_NO_QUAD, __LINE__, __func__, __FILE__,
                    MSG_NO_QUAD);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_QUAD);
  }

  if (dkyQ == NULL)
  {
    IDAProcessError(IDA_mem, IDA_BAD_DKY, __LINE__, __func__, __FILE__,
                    MSG_NULL_DKY);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_DKY);
  }

  if ((k < 0) || (k > IDA_mem->ida_kk))
  {
    IDAProcessError(IDA_mem, IDA_BAD_K, __LINE__, __func__, __FILE__, MSG_BAD_K);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_K);
  }

  /* Check t for legality.  Here tn - hused is t_{n-1}. */

  tfuzz = HUNDRED * IDA_mem->ida_uround * (IDA_mem->ida_tn + IDA_mem->ida_hh);
  tp    = IDA_mem->ida_tn - IDA_mem->ida_hused - tfuzz;
  if ((t - tp) * IDA_mem->ida_hh < ZERO)
  {
    IDAProcessError(IDA_mem, IDA_BAD_T, __LINE__, __func__, __FILE__, MSG_BAD_T,
                    t, IDA_mem->ida_tn - IDA_mem->ida_hused, IDA_mem->ida_tn);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_T);
  }

  /* Initialize the c_j^(k) and c_k^(k-1) */
  for (i = 0; i < MXORDP1; i++)
  {
    cjk[i]   = 0;
    cjk_1[i] = 0;
  }
  delt = t - IDA_mem->ida_tn;

  for (i = 0; i <= k; i++)
  {
    if (i == 0)
    {
      cjk[i] = 1;
      psij_1 = 0;
    }
    else
    {
      cjk[i] = cjk[i - 1] * i / IDA_mem->ida_psi[i - 1];
      psij_1 = IDA_mem->ida_psi[i - 1];
    }

    /* update c_j^(i) */
    for (j = i + 1; j <= IDA_mem->ida_kused - k + i; j++)
    {
      cjk[j] = (i * cjk_1[j - 1] + cjk[j - 1] * (delt + psij_1)) /
               IDA_mem->ida_psi[j - 1];
      psij_1 = IDA_mem->ida_psi[j - 1];
    }

    /* save existing c_j^(i)'s */
    for (j = i + 1; j <= IDA_mem->ida_kused - k + i; j++) { cjk_1[j] = cjk[j]; }
  }

  /* Compute sum (c_j(t) * phi(t)) */

  retval = N_VLinearCombination(IDA_mem->ida_kused - k + 1, cjk + k,
                                IDA_mem->ida_phiQ + k, dkyQ);
  if (retval != IDA_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_VECTOROP_ERR);
  }

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}